

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O0

string * __thiscall json::array::dump_abi_cxx11_(string *__return_storage_ptr__,array *this)

{
  bool bVar1;
  reference ppvVar2;
  string local_68 [32];
  __normal_iterator<json::value_*const_*,_std::vector<json::value_*,_std::allocator<json::value_*>_>_>
  local_48;
  __normal_iterator<json::value_*const_*,_std::vector<json::value_*,_std::allocator<json::value_*>_>_>
  local_40;
  __normal_iterator<json::value_*const_*,_std::vector<json::value_*,_std::allocator<json::value_*>_>_>
  local_38;
  const_iterator i;
  array *this_local;
  string *output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'[');
  local_38._M_current =
       (value **)std::vector<json::value_*,_std::allocator<json::value_*>_>::begin(&this->_data);
  while( true ) {
    local_40._M_current =
         (value **)std::vector<json::value_*,_std::allocator<json::value_*>_>::end(&this->_data);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    local_48._M_current =
         (value **)std::vector<json::value_*,_std::allocator<json::value_*>_>::begin(&this->_data);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_48);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,',');
    }
    ppvVar2 = __gnu_cxx::
              __normal_iterator<json::value_*const_*,_std::vector<json::value_*,_std::allocator<json::value_*>_>_>
              ::operator*(&local_38);
    (*(*ppvVar2)->_vptr_value[3])(local_68);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_68);
    std::__cxx11::string::~string(local_68);
    __gnu_cxx::
    __normal_iterator<json::value_*const_*,_std::vector<json::value_*,_std::allocator<json::value_*>_>_>
    ::operator++(&local_38);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,']');
  return __return_storage_ptr__;
}

Assistant:

std::string json::array::dump () const
{
  std::string output;
  output += '[';

  for (auto i = _data.begin (); i != _data.end (); ++i)
  {
    if (i != _data.begin ())
      output += ',';

    output += (*i)->dump ();
  }

  output += ']';
  return output;
}